

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_7193f5::HighbdDrPredTest_OperationCheck_Test::TestBody
          (HighbdDrPredTest_OperationCheck_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint p_angle;
  
  if ((this->super_HighbdDrPredTest).
      super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
      .params_.tst_fn !=
      (_func_void_unsigned_short_ptr_long_int_int_unsigned_short_ptr_unsigned_short_ptr_int_int_int_int_int
       *)0x0) {
    (this->super_HighbdDrPredTest).
    super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
    .enable_upsample_ = 0;
    iVar2 = (this->super_HighbdDrPredTest).
            super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
            .stop_angle_;
    iVar3 = 0;
    do {
      p_angle = (this->super_HighbdDrPredTest).
                super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
                .start_angle_;
      if ((int)p_angle < iVar2) {
        uVar6 = 0xb4 - p_angle;
        do {
          if (p_angle - 1 < 0x59) {
            iVar3 = (int)dr_intra_derivative[p_angle];
            (this->super_HighbdDrPredTest).
            super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
            .dx_ = iVar3;
            iVar5 = 1;
          }
          else {
            if (p_angle - 0x5b < 0x59) {
              iVar3 = (int)dr_intra_derivative[uVar6];
              (this->super_HighbdDrPredTest).
              super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
              .dx_ = iVar3;
              uVar4 = p_angle - 0x5a;
            }
            else {
              (this->super_HighbdDrPredTest).
              super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
              .dx_ = 1;
              iVar3 = 1;
              iVar5 = 1;
              if (0x58 < p_angle - 0xb5) goto LAB_004ad07d;
              uVar4 = uVar6 + 0x5a;
            }
            iVar5 = (int)dr_intra_derivative[uVar4];
          }
LAB_004ad07d:
          (this->super_HighbdDrPredTest).
          super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
          .dy_ = iVar5;
          if ((iVar3 != 0) && (iVar5 != 0)) {
            DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
            ::RunTest((DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
                       *)this,false,false,p_angle);
            iVar2 = (this->super_HighbdDrPredTest).
                    super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
                    .stop_angle_;
          }
          p_angle = p_angle + 1;
          uVar6 = uVar6 - 1;
        } while ((int)p_angle < iVar2);
        iVar3 = (this->super_HighbdDrPredTest).
                super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
                .enable_upsample_;
      }
      (this->super_HighbdDrPredTest).
      super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
      .enable_upsample_ = iVar3 + 1;
      bVar1 = iVar3 < 1;
      iVar3 = iVar3 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

TEST_P(HighbdDrPredTest, OperationCheck) {
  if (params_.tst_fn == nullptr) return;
  for (enable_upsample_ = 0; enable_upsample_ < 2; ++enable_upsample_) {
    for (int angle = start_angle_; angle < stop_angle_; angle++) {
      dx_ = av1_get_dx(angle);
      dy_ = av1_get_dy(angle);
      if (dx_ && dy_) RunTest(false, false, angle);
    }
  }
}